

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::cleanupAnswerTable
          (RpcCallContext *this,Array<unsigned_int> *resultExports,bool shouldFreePipeline)

{
  size_t sVar1;
  bool bVar2;
  RpcConnectionState *pRVar3;
  Answer **ppAVar4;
  Array<unsigned_int> *other;
  Maybe<kj::Own<capnp::PipelineHook,_std::nullptr_t>_> local_150;
  Fault local_140;
  Fault f_1;
  size_t local_130;
  DebugExpression<unsigned_long> local_128;
  undefined1 local_120 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_1;
  Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext_&> local_f0;
  Answer *local_e8;
  Fault local_e0;
  undefined1 local_d8 [16];
  Answer *_kj_result;
  Answer *answer;
  Fault local_68;
  Fault f;
  size_t local_58;
  DebugExpression<unsigned_long> local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  bool shouldFreePipeline_local;
  Array<unsigned_int> *resultExports_local;
  RpcCallContext *this_local;
  
  _kjCondition._39_1_ = shouldFreePipeline;
  if ((this->receivedFinish & 1U) == 0) {
    pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       (&this->connectionState);
    anon_unknown_18::ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>
    ::find((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *)
           local_d8,(int)pRVar3 + 0x2d8);
    local_d8._8_8_ =
         kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::Answer>
                   ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Answer_&> *)local_d8);
    if ((Answer *)local_d8._8_8_ == (Answer *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xd55,FAILED,"connectionState->answers.find(answerId) != nullptr","");
      kj::_::Debug::Fault::fatal(&local_e0);
    }
    ppAVar4 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::Answer*>
                        ((Answer **)(local_d8 + 8));
    local_e8 = *ppAVar4;
    _kj_result = local_e8;
    kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext_&>::Maybe(&local_f0);
    kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext_&>::operator=
              (&_kj_result->callContext,&local_f0);
    other = kj::mv<kj::Array<unsigned_int>>(resultExports);
    kj::Array<unsigned_int>::operator=(&_kj_result->resultExports,other);
    if ((_kjCondition._39_1_ & 1) != 0) {
      local_130 = kj::Array<unsigned_int>::size(resultExports);
      local_128 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_130);
      f_1.exception._4_4_ = 0;
      kj::_::DebugExpression<unsigned_long>::operator==
                ((DebugComparison<unsigned_long,_int> *)local_120,&local_128,
                 (int *)((long)&f_1.exception + 4));
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_120);
      if (!bVar2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                  (&local_140,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xd5c,FAILED,"resultExports.size() == 0","_kjCondition,",
                   (DebugComparison<unsigned_long,_int> *)local_120);
        kj::_::Debug::Fault::fatal(&local_140);
      }
      kj::Maybe<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>::Maybe();
      kj::Maybe<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>::operator=
                (&_kj_result->pipeline,&local_150);
      kj::Maybe<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>::~Maybe(&local_150);
    }
  }
  else {
    local_58 = kj::Array<unsigned_int>::size(resultExports);
    local_50 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_int> *)local_48,&local_50,
               (int *)((long)&f.exception + 4));
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
    if (!bVar2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xd51,FAILED,"resultExports.size() == 0","_kjCondition,",
                 (DebugComparison<unsigned_long,_int> *)local_48);
      kj::_::Debug::Fault::fatal(&local_68);
    }
    pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       (&this->connectionState);
    anon_unknown_18::ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>
    ::erase((Answer *)&answer,&pRVar3->answers,this->answerId);
    Answer::~Answer((Answer *)&answer);
  }
  sVar1 = this->requestSize;
  pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     (&this->connectionState);
  pRVar3->callWordsInFlight = pRVar3->callWordsInFlight - sVar1;
  pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     (&this->connectionState);
  maybeUnblockFlow(pRVar3);
  if ((this->receivedFinish & 1U) != 0) {
    pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       (&this->connectionState);
    checkIfBecameIdle(pRVar3);
  }
  return;
}

Assistant:

void cleanupAnswerTable(kj::Array<ExportId> resultExports, bool shouldFreePipeline) {
      // We need to remove the `callContext` pointer -- which points back to us -- from the
      // answer table.  Or we might even be responsible for removing the entire answer table
      // entry.

      if (receivedFinish) {
        // Already received `Finish` so it's our job to erase the table entry. We shouldn't have
        // sent results if canceled, so we shouldn't have an export list to deal with.
        KJ_ASSERT(resultExports.size() == 0);
        connectionState->answers.erase(answerId);
      } else {
        // We just have to null out callContext and set the exports.
        auto& answer = KJ_ASSERT_NONNULL(connectionState->answers.find(answerId));
        answer.callContext = kj::none;
        answer.resultExports = kj::mv(resultExports);

        if (shouldFreePipeline) {
          // We can free the pipeline early, because we know all pipeline calls are invalid (e.g.
          // because there are no caps in the result to receive pipeline requests).
          KJ_ASSERT(resultExports.size() == 0);
          answer.pipeline = kj::none;
        }
      }

      // Also, this is the right time to stop counting the call against the flow limit.
      connectionState->callWordsInFlight -= requestSize;
      connectionState->maybeUnblockFlow();

      // If we erased the answer table entry above, check for idleness now.
      if (receivedFinish) {
        connectionState->checkIfBecameIdle();
      }
    }